

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O1

void __thiscall EventDispatcherHelper::~EventDispatcherHelper(EventDispatcherHelper *this)

{
  list<EventDispatcherHelper::EventListenerNode_*> *this_00;
  Node *pNVar1;
  Node *pNVar2;
  
  this_00 = &this->mEventList;
  pNVar2 = ((this->mEventList).mHead)->next;
  if (pNVar2 != (this->mEventList).mTail) {
    do {
      if (pNVar2->val != (EventListenerNode *)0x0) {
        operator_delete(pNVar2->val,0x10);
      }
      pNVar2 = pNVar2->next;
    } while (pNVar2 != (this->mEventList).mTail);
  }
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::clear(this_00);
  pNVar2 = this_00->mHead;
  while (pNVar2 != (Node *)0x0) {
    pNVar1 = pNVar2->next;
    operator_delete(pNVar2,0x18);
    this_00->mHead = pNVar1;
    pNVar2 = pNVar1;
  }
  (this->mEventList).mTail = (Node *)0x0;
  Mutex::~Mutex(&this->mLock);
  return;
}

Assistant:

EventDispatcherHelper::~EventDispatcherHelper()
{
	TRACE_BEGIN(LOG_LVL_INFO);

	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		delete *i;
	}

	mEventList.clear();
}